

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall cfd::core::Pubkey::Compress(Pubkey *__return_storage_ptr__,Pubkey *this)

{
  bool bVar1;
  Pubkey *in_stack_ffffffffffffff88;
  ByteData *__return_storage_ptr___00;
  Pubkey *this_00;
  ByteData local_48;
  undefined1 local_30 [8];
  ByteData compress_data;
  Pubkey *this_local;
  
  this_00 = __return_storage_ptr__;
  compress_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = IsCompress(this);
  if (bVar1) {
    Pubkey(this_00,in_stack_ffffffffffffff88);
  }
  else {
    __return_storage_ptr___00 = (ByteData *)local_30;
    WallyUtil::CompressPubkey(__return_storage_ptr___00,&this->data_);
    ByteData::ByteData(&this_00->data_,__return_storage_ptr___00);
    Pubkey(this_00,&local_48);
    ByteData::~ByteData((ByteData *)0x44f185);
    ByteData::~ByteData((ByteData *)0x44f18e);
  }
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::Compress() const {
  if (IsCompress()) {
    return *this;
  }

  ByteData compress_data = WallyUtil::CompressPubkey(data_);
  return Pubkey(compress_data);
}